

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

token * __thiscall libchars::commands::find_key(commands *this,char *name)

{
  token *ptVar1;
  int iVar2;
  token *ptVar3;
  
  ptVar3 = (token *)0x0;
  if ((name != (char *)0x0) && (this->cmd != (command *)0x0)) {
    for (ptVar3 = this->t_par; ptVar3 != (token *)0x0; ptVar3 = ptVar3->next) {
      iVar2 = std::__cxx11::string::compare((char *)&ptVar3->name);
      if ((iVar2 == 0) && (ptVar3->ttype == KEY)) {
        ptVar1 = ptVar3->next;
        if ((ptVar1 != (token *)0x0) && (ptVar1->ttype == KEY)) {
          if ((ptVar1->status & 0x800) != 0) {
            return ptVar3;
          }
          return (token *)0x0;
        }
        return (token *)0x0;
      }
    }
  }
  return ptVar3;
}

Assistant:

token *commands::find_key(const char *name)
    {
        if (name == NULL)
            return NULL;
        if (cmd == NULL)
            return NULL;

        token *T = t_par;
        while (T != NULL && (T->name != name || T->ttype != token::KEY))
            T = T->next;

        if (T != NULL) {
            if (T->next == NULL)
                return NULL; // {key,value} pair missing 'value'
            else if (T->next->ttype != token::KEY)
                return NULL; // {key,value} pair missing 'value'
            else if (!(T->next->status & token::IS_VALUE))
                return NULL; // {key,value} pair invalid 'value'
        }

        return T;
    }